

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_transaction_FundRawTransaction_BTC1_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_BTC1_Test *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  void *handle_00;
  void *fund_handle_00;
  bool bVar4;
  long *plVar5;
  value_type_conflict *__val;
  pointer pUVar6;
  char *pcVar7;
  char *in_R9;
  void **create_handle_00;
  int ret;
  char *address;
  AssertionResult gtest_ar;
  undefined1 local_d8 [16];
  AssertionResult gtest_ar_;
  undefined1 local_b8 [16];
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  char *output_tx_hex;
  pointer local_98;
  void *handle;
  void *fund_handle;
  AssertHelper local_70;
  void *create_handle;
  char *tx;
  uint32_t append_txout_count;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x43b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (gtest_ar_._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&output_tx_hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxos,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x43c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxos,(Message *)&output_tx_hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxos);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_d8) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (output_tx_hex != (char *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (output_tx_hex != (char *)0x0)) {
        (**(code **)(*(long *)output_tx_hex + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  fund_handle = (void *)0x0;
  CfdGetElementsUtxoListByC(&utxos,true);
  create_handle_00 = &create_handle;
  create_handle = (void *)0x0;
  ret = CfdInitializeTransaction(handle,0,1,0x11,(char *)0x0,create_handle_00);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x44f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (gtest_ar_._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = create_handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (create_handle == (void *)0x0) {
    testing::Message::Message((Message *)&output_tx_hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"(NULL == create_handle)","true","false",(char *)create_handle_00)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&address,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x450,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&address,(Message *)&output_tx_hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&address);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_d8) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (output_tx_hex != (char *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (output_tx_hex != (char *)0x0)) {
        (**(code **)(*(long *)output_tx_hex + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  tx = (char *)0x0;
  if (ret == 0) {
    ret = CfdAddTransactionInput
                    (handle,create_handle,
                     "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff",0,0xfffffffe
                    );
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x458,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (gtest_ar_._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdAddTransactionOutput
                    (handle,create_handle,0x6b22c20,"bc1qcevcszwsnmd2ew857n2mnwq7gsf62ujrutrfch",
                     (char *)0x0,(char *)0x0);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x45c,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (gtest_ar_._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdFinalizeTransaction(handle,create_handle,&tx);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x45e,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (gtest_ar_._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "\"0100000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff01202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000\""
               ,"tx",
               "0100000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff01202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
               ,tx);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x45f,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (gtest_ar_._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdFreeTransactionHandle(handle,create_handle);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x461,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (gtest_ar_._0_8_ != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      ret = CfdInitializeFundRawTx(handle,0,1,(char *)0x0,&fund_handle);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x468,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
        if (gtest_ar_._0_8_ != 0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      testing::internal::CmpHelperNE<decltype(nullptr),void*>
                ((internal *)&gtest_ar,"nullptr","fund_handle",(void **)&gtest_ar_,&fund_handle);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x469,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
        if (gtest_ar_._0_8_ != 0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (ret == 0) {
        if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_start !=
            utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pUVar6 = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            plVar5 = (long *)operator_new(0x20);
            address = (char *)(plVar5 + 4);
            lVar1 = *(long *)pUVar6->txid;
            lVar2 = *(long *)(pUVar6->txid + 8);
            lVar3 = *(long *)(pUVar6->txid + 0x18);
            plVar5[2] = *(long *)(pUVar6->txid + 0x10);
            plVar5[3] = lVar3;
            *plVar5 = lVar1;
            plVar5[1] = lVar2;
            local_a8._M_current = (uchar *)plVar5;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gtest_ar_,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&address,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_a8,(allocator_type *)&output_tx_hex);
            cfd::core::ByteData::ByteData
                      ((ByteData *)&output_tx_hex,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
            cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)&output_tx_hex);
            if (output_tx_hex != (char *)0x0) {
              operator_delete(output_tx_hex);
            }
            if (gtest_ar_._0_8_ != 0) {
              operator_delete((void *)gtest_ar_._0_8_);
            }
            operator_delete(plVar5);
            fund_handle_00 = fund_handle;
            handle_00 = handle;
            cfd::core::Txid::Txid((Txid *)&output_tx_hex,(string *)&gtest_ar);
            cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar_,(Txid *)&output_tx_hex);
            ret = CfdAddUtxoForFundRawTx
                            (handle_00,fund_handle_00,(char *)gtest_ar_._0_8_,pUVar6->vout,
                             pUVar6->amount,
                             "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))"
                             ,"");
            if ((undefined1 *)gtest_ar_._0_8_ != local_b8) {
              operator_delete((void *)gtest_ar_._0_8_);
            }
            output_tx_hex = "\x04\v\x1e";
            if (local_98 != (pointer)0x0) {
              operator_delete(local_98);
            }
            output_tx_hex = (char *)((ulong)output_tx_hex & 0xffffffff00000000);
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&output_tx_hex,
                       &ret);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&output_tx_hex);
              pcVar7 = "";
              if (gtest_ar_.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&address,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                         ,0x475,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&address,(Message *)&output_tx_hex);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&address);
              if (output_tx_hex != (char *)0x0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) && (output_tx_hex != (char *)0x0)) {
                  (**(code **)(*(long *)output_tx_hex + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_d8) {
              operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            }
            pUVar6 = pUVar6 + 1;
          } while (pUVar6 != utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl
                             .super__Vector_impl_data._M_finish);
        }
        pcVar7 = "";
        ret = CfdAddTxInForFundRawTx
                        (handle,fund_handle,
                         "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff",0,
                         0x6b22c20,
                         "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))"
                         ,"",false,false,false,0,"");
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x47e,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
          if (gtest_ar_._0_8_ != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pcVar7 = "";
        ret = CfdAddTargetAmountForFundRawTx
                        (handle,fund_handle,0,0x3eeb724,"",
                         "bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce");
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x482,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
          if (gtest_ar_._0_8_ != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        ret = CfdSetOptionFundRawTx(handle,fund_handle,1,0,0.0,true);
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x486,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
          if (gtest_ar_._0_8_ != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        ret = CfdSetOptionFundRawTx(handle,fund_handle,2,0,-1.0,false);
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x489,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
          if (gtest_ar_._0_8_ != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        ret = CfdSetOptionFundRawTx(handle,fund_handle,3,0,10.0,false);
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x48c,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
          if (gtest_ar_._0_8_ != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        ret = CfdSetOptionFundRawTx(handle,fund_handle,4,-1,0.0,false);
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x48f,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
          if (gtest_ar_._0_8_ != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        append_txout_count = 0;
        output_tx_hex = (char *)0x0;
        ret = CfdFinalizeFundRawTx
                        (handle,fund_handle,tx,10.0,(int64_t *)&gtest_ar_,&append_txout_count,
                         &output_tx_hex);
        address = (char *)((ulong)address & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&address,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&address);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x497,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&address);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (address != (char *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (address != (char *)0x0)) {
              (**(code **)(*(long *)address + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        address = (char *)CONCAT44(address._4_4_,0xa0a);
        testing::internal::CmpHelperEQ<int,long>
                  ((internal *)&gtest_ar,"2570","tx_fee_amount",(int *)&address,(long *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&address);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x498,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&address);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (address != (char *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (address != (char *)0x0)) {
              (**(code **)(*(long *)address + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        address = (char *)CONCAT44(address._4_4_,1);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"1","append_txout_count",(int *)&address,
                   &append_txout_count);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&address);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x499,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&address);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (address != (char *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (address != (char *)0x0)) {
              (**(code **)(*(long *)address + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (ret == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&gtest_ar,
                     "\"0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff02202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a57243be0da804000000001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000\""
                     ,"output_tx_hex",
                     "0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff02202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a57243be0da804000000001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
                     ,output_tx_hex);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&address);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x49b,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_a8,(Message *)&address);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
            if (address != (char *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) && (address != (char *)0x0)) {
                (**(code **)(*(long *)address + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          CfdFreeStringBuffer(output_tx_hex);
        }
        address = (char *)0x0;
        ret = CfdGetAppendTxOutFundRawTx(handle,fund_handle,0,&address);
        local_a8._M_current = local_a8._M_current & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_a8,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_a8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x4a1,pcVar7);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((long *)local_a8._M_current != (long *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && ((long *)local_a8._M_current != (long *)0x0)) {
              (**(code **)(*(long *)local_a8._M_current + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar,"\"bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce\"","address",
                   "bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce",address);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_a8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x4a2,pcVar7);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((long *)local_a8._M_current != (long *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && ((long *)local_a8._M_current != (long *)0x0)) {
              (**(code **)(*(long *)local_a8._M_current + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (ret == 0) {
          CfdFreeStringBuffer(address);
        }
      }
    }
  }
  ret = CfdFreeFundRawTxHandle(handle,fund_handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x4a8,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (gtest_ar_._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  CfdFreeStringBuffer(tx);
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x4ad,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&gtest_ar_)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (gtest_ar_._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_BTC1) {
  constexpr const char* kDescriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))";
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  auto convert_to_byte = [](const uint8_t* byte_array, size_t size) -> std::string {
    std::vector<uint8_t> bytes(size);
    memcpy(bytes.data(), byte_array, bytes.size());
    std::vector<uint8_t> reverse_buffer(bytes.crbegin(), bytes.crend());
    return ByteData(reverse_buffer).GetHex();
  };

  void* fund_handle = nullptr;
  std::vector<Utxo> utxos = CfdGetElementsUtxoListByC(true);
  double effective_fee_rate = 10.0;
  double long_term_fee_rate = 10.0;
  double dust_fee_rate = -1;
  int64_t knapsack_min_change = -1;

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(
      handle, kCfdNetworkMainnet, 1, 17, nullptr, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));

  char* tx = nullptr;
  int64_t amount = 112340000;
  const char* txid1 = "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff";
  uint32_t vout1 = 0;
  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(handle, create_handle, txid1, vout1, 0xfffffffe);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddTransactionOutput(
        handle, create_handle, amount, "bc1qcevcszwsnmd2ew857n2mnwq7gsf62ujrutrfch",
        nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdFinalizeTransaction(handle, create_handle, &tx);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("0100000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff01202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000", tx);
    ret = CfdFreeTransactionHandle(handle, create_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  uint32_t target_asset_count = 1;
  if (ret == kCfdSuccess) {
    ret = CfdInitializeFundRawTx(
        handle, kCfdNetworkMainnet, target_asset_count, nullptr, &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_NE(nullptr, fund_handle);
  }

  if (ret == kCfdSuccess) {
    for (const auto& utxo : utxos) {
      std::string txid = convert_to_byte(utxo.txid, sizeof(utxo.txid));
      ret = CfdAddUtxoForFundRawTx(
          handle, fund_handle,
          Txid(txid).GetHex().c_str(), utxo.vout,
          utxo.amount,
          kDescriptor,
          "");
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdAddTxInForFundRawTx(handle, fund_handle,
        "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff", 0,
        amount,  kDescriptor, "", false, false, false, 0, "");
    // ret = CfdAddTxInputForFundRawTx(handle, fund_handle,
    //     "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff", 0,
    //     amount,  kDescriptor, "", false, false, false, "", 0, 0, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0, 65976100,
        "", "bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
        0, 0, true);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxDustFeeRate,
        0, dust_fee_rate, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxLongTermFeeRate,
        0, long_term_fee_rate, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxKnapsackMinChange,
        knapsack_min_change, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t tx_fee_amount = 0;
    uint32_t append_txout_count = 0;
    char* output_tx_hex = nullptr;
    ret = CfdFinalizeFundRawTx(handle, fund_handle, tx,
        effective_fee_rate, &tx_fee_amount, &append_txout_count,
        &output_tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2570, tx_fee_amount);
    EXPECT_EQ(1, append_txout_count);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff02202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a57243be0da804000000001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000", output_tx_hex);
      CfdFreeStringBuffer(output_tx_hex);
    }

    char* address = nullptr;
    ret = CfdGetAppendTxOutFundRawTx(handle, fund_handle, 0, &address);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce", address);
    if (ret == kCfdSuccess) {
      CfdFreeStringBuffer(address);
    }
  }
  ret = CfdFreeFundRawTxHandle(handle, fund_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  CfdFreeStringBuffer(tx);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}